

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

SMDiagnostic * __thiscall
llvm::SourceMgr::GetMessage
          (SMDiagnostic *__return_storage_ptr__,SourceMgr *this,SMLoc Loc,DiagKind Kind,Twine *Msg,
          ArrayRef<llvm::SMRange> Ranges,ArrayRef<llvm::SMFixIt> FixIts)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  StringRef Msg_00;
  StringRef LineStr_00;
  ArrayRef<std::pair<unsigned_int,_unsigned_int>_> Ranges_00;
  StringRef FN;
  uint i;
  int iVar4;
  MemoryBuffer *pMVar5;
  undefined4 extraout_var;
  SMRange *pSVar6;
  pair<unsigned_int,_unsigned_int> pVar7;
  size_t extraout_RDX;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  SMLoc SVar11;
  char *pcVar12;
  size_t Index;
  char *local_100;
  size_t local_f8;
  string local_c0;
  pointer local_a0;
  size_type sStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  size_t sStack_88;
  string LineStr;
  SmallVector<std::pair<unsigned_int,_unsigned_int>,_4U> ColRanges;
  
  ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.super_SmallVectorBase
  .BeginX = &ColRanges.super_SmallVectorStorage<std::pair<unsigned_int,_unsigned_int>,_4U>;
  LineStr._M_dataplus._M_p = (pointer)&LineStr.field_2;
  LineStr._M_string_length = 0;
  ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.super_SmallVectorBase
  .Size = 0;
  ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>.
  super_SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>.
  super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.super_SmallVectorBase
  .Capacity = 4;
  LineStr.field_2._M_local_buf[0] = '\0';
  if (Loc.Ptr == (char *)0x0) {
    iVar4 = -1;
    pVar7.first = 0;
    pVar7.second = 0;
    local_f8 = 9;
    local_100 = "<unknown>";
  }
  else {
    i = FindBufferContainingLoc(this,Loc);
    if (i == 0) {
      __assert_fail("CurBuf && \"Invalid or unspecified location!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SourceMgr.cpp"
                    ,0xb5,
                    "SMDiagnostic llvm::SourceMgr::GetMessage(SMLoc, SourceMgr::DiagKind, const Twine &, ArrayRef<SMRange>, ArrayRef<SMFixIt>) const"
                   );
    }
    pMVar5 = getMemoryBuffer(this,i);
    iVar4 = (*pMVar5->_vptr_MemoryBuffer[2])(pMVar5);
    local_100 = (char *)CONCAT44(extraout_var,iVar4);
    SVar11.Ptr = Loc.Ptr;
    while (pcVar9 = pMVar5->BufferStart, SVar11.Ptr != pMVar5->BufferStart) {
      pcVar12 = SVar11.Ptr + -1;
      pcVar9 = SVar11.Ptr;
      if ((*pcVar12 == '\r') || (SVar11.Ptr = SVar11.Ptr + -1, *pcVar12 == '\n')) break;
    }
    for (SVar11.Ptr = Loc.Ptr;
        ((pcVar12 = pMVar5->BufferEnd, SVar11.Ptr != pMVar5->BufferEnd &&
         (pcVar12 = SVar11.Ptr, *SVar11.Ptr != '\n')) && (*SVar11.Ptr != '\r'));
        SVar11.Ptr = SVar11.Ptr + 1) {
    }
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar9,pcVar12);
    std::__cxx11::string::operator=((string *)&LineStr,(string *)&local_c0);
    std::__cxx11::string::_M_dispose();
    uVar10 = (ulong)(uint)Ranges.Length;
    for (Index = 0; uVar10 != Index; Index = Index + 1) {
      pSVar6 = ArrayRef<llvm::SMRange>::operator[](&Ranges,Index);
      pcVar1 = (pSVar6->Start).Ptr;
      if (((pcVar1 != (char *)0x0) && (pcVar1 <= pcVar12)) &&
         (pcVar2 = (pSVar6->End).Ptr, pcVar9 <= pcVar2)) {
        iVar8 = (int)pcVar9;
        iVar4 = (int)pcVar1;
        if (pcVar1 < pcVar9) {
          iVar4 = iVar8;
        }
        iVar3 = (int)pcVar2;
        if (pcVar12 < pcVar2) {
          iVar3 = (int)pcVar12;
        }
        local_c0._M_dataplus._M_p._4_4_ = iVar3 - iVar8;
        local_c0._M_dataplus._M_p._0_4_ = iVar4 - iVar8;
        SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true> *)
                   &ColRanges,(pair<unsigned_int,_unsigned_int> *)&local_c0);
      }
    }
    pVar7 = getLineAndColumn(this,Loc,i);
    iVar4 = pVar7.second - 1;
    local_f8 = extraout_RDX;
  }
  Twine::str_abi_cxx11_(&local_c0,Msg);
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c0._M_dataplus._M_p;
  sStack_88 = local_c0._M_string_length;
  local_a0 = LineStr._M_dataplus._M_p;
  sStack_98 = LineStr._M_string_length;
  FN.Length = local_f8;
  FN.Data = local_100;
  Msg_00.Length = local_c0._M_string_length;
  Msg_00.Data = local_c0._M_dataplus._M_p;
  LineStr_00.Length = LineStr._M_string_length;
  LineStr_00.Data = LineStr._M_dataplus._M_p;
  Ranges_00.Length =
       ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>.
       super_SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>.
       super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
       super_SmallVectorBase._8_8_ & 0xffffffff;
  Ranges_00.Data =
       (pair<unsigned_int,_unsigned_int> *)
       ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>.
       super_SmallVectorTemplateBase<std::pair<unsigned_int,_unsigned_int>,_true>.
       super_SmallVectorTemplateCommon<std::pair<unsigned_int,_unsigned_int>,_void>.
       super_SmallVectorBase.BeginX;
  SMDiagnostic::SMDiagnostic
            (__return_storage_ptr__,this,Loc,FN,pVar7.first,iVar4,Kind,Msg_00,LineStr_00,Ranges_00,
             FixIts);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>::~SmallVectorImpl
            (&ColRanges.super_SmallVectorImpl<std::pair<unsigned_int,_unsigned_int>_>);
  return __return_storage_ptr__;
}

Assistant:

SMDiagnostic SourceMgr::GetMessage(SMLoc Loc, SourceMgr::DiagKind Kind,
                                   const Twine &Msg,
                                   ArrayRef<SMRange> Ranges,
                                   ArrayRef<SMFixIt> FixIts) const {
  // First thing to do: find the current buffer containing the specified
  // location to pull out the source line.
  SmallVector<std::pair<unsigned, unsigned>, 4> ColRanges;
  std::pair<unsigned, unsigned> LineAndCol;
  StringRef BufferID = "<unknown>";
  std::string LineStr;

  if (Loc.isValid()) {
    unsigned CurBuf = FindBufferContainingLoc(Loc);
    assert(CurBuf && "Invalid or unspecified location!");

    const MemoryBuffer *CurMB = getMemoryBuffer(CurBuf);
    BufferID = CurMB->getBufferIdentifier();

    // Scan backward to find the start of the line.
    const char *LineStart = Loc.getPointer();
    const char *BufStart = CurMB->getBufferStart();
    while (LineStart != BufStart && LineStart[-1] != '\n' &&
           LineStart[-1] != '\r')
      --LineStart;

    // Get the end of the line.
    const char *LineEnd = Loc.getPointer();
    const char *BufEnd = CurMB->getBufferEnd();
    while (LineEnd != BufEnd && LineEnd[0] != '\n' && LineEnd[0] != '\r')
      ++LineEnd;
    LineStr = std::string(LineStart, LineEnd);

    // Convert any ranges to column ranges that only intersect the line of the
    // location.
    for (unsigned i = 0, e = Ranges.size(); i != e; ++i) {
      SMRange R = Ranges[i];
      if (!R.isValid()) continue;

      // If the line doesn't contain any part of the range, then ignore it.
      if (R.Start.getPointer() > LineEnd || R.End.getPointer() < LineStart)
        continue;

      // Ignore pieces of the range that go onto other lines.
      if (R.Start.getPointer() < LineStart)
        R.Start = SMLoc::getFromPointer(LineStart);
      if (R.End.getPointer() > LineEnd)
        R.End = SMLoc::getFromPointer(LineEnd);

      // Translate from SMLoc ranges to column ranges.
      // FIXME: Handle multibyte characters.
      ColRanges.push_back(std::make_pair(R.Start.getPointer()-LineStart,
                                         R.End.getPointer()-LineStart));
    }

    LineAndCol = getLineAndColumn(Loc, CurBuf);
  }

  return SMDiagnostic(*this, Loc, BufferID, LineAndCol.first,
                      LineAndCol.second-1, Kind, Msg.str(),
                      LineStr, ColRanges, FixIts);
}